

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressionTables.cpp
# Opt level: O0

void testQuantizer(float tol)

{
  imath_half_bits_t iVar1;
  uint16_t uVar2;
  uint16_t h_00;
  float in_XMM0_Da;
  float fVar3;
  float fVar4;
  float fVar5;
  uint16_t unaff_retaddr;
  uint16_t unaff_retaddr_00;
  uint16_t aq;
  uint16_t tq;
  float hFloat;
  uint16_t hval;
  int h;
  int failcount;
  uint16_t halfTol;
  double in_stack_ffffffffffffffd8;
  float in_stack_ffffffffffffffe0;
  imath_half_bits_t in_stack_ffffffffffffffe6;
  uint local_10;
  uint doprint;
  undefined2 in_stack_fffffffffffffff8;
  float srcFloat;
  
  iVar1 = imath_float_to_half(in_XMM0_Da);
  srcFloat = (float)CONCAT22(iVar1,in_stack_fffffffffffffff8);
  doprint = 0;
  for (local_10 = 0; (int)local_10 < 0x10000; local_10 = local_10 + 1) {
    imath_half_to_float((imath_half_bits_t)local_10);
    in_stack_ffffffffffffffe6 =
         tableQuantize(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0,
                       (float)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                       SUB84(in_stack_ffffffffffffffd8,0));
    uVar2 = algoQuantize(unaff_retaddr_00,unaff_retaddr,in_XMM0_Da,srcFloat,doprint);
    if ((in_stack_ffffffffffffffe6 != uVar2) &&
       (doprint = doprint + 1, testQuantizer::didfirstprint == 0)) {
      uVar2 = tableQuantize(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0,
                            (float)((ulong)in_stack_ffffffffffffffd8 >> 0x20),
                            SUB84(in_stack_ffffffffffffffd8,0));
      h_00 = algoQuantize(unaff_retaddr_00,unaff_retaddr,in_XMM0_Da,srcFloat,doprint);
      testQuantizer::didfirstprint = 1;
      in_stack_ffffffffffffffd8 = (double)in_XMM0_Da;
      fVar3 = imath_half_to_float((imath_half_bits_t)local_10);
      in_stack_ffffffffffffffe6 = uVar2;
      fVar4 = imath_half_to_float(uVar2);
      fVar5 = imath_half_to_float(h_00);
      printf("ERROR: tol %g half %u 0x%04X %g: table 0x%04X %g algo 0x%04X %g\n",
             in_stack_ffffffffffffffd8,(double)fVar3,(double)fVar4,(double)fVar5,
             (ulong)(local_10 & 0xffff),(ulong)(local_10 & 0xffff),(ulong)uVar2,(ulong)h_00);
    }
  }
  if (0 < (int)doprint) {
    printf("ERROR: tol %g: %d fails\n",(double)in_XMM0_Da,(ulong)doprint);
  }
  return;
}

Assistant:

static void testQuantizer (float tol)
{
    uint16_t halfTol = imath_float_to_half (tol);

    int failcount = 0;
    for ( int h = 0; h < 65536; ++h )
    {
        uint16_t hval = h;
        float    hFloat = imath_half_to_float (hval);
        uint16_t tq = tableQuantize (hval, tol, hFloat, 0);
        uint16_t aq = algoQuantize (hval, halfTol, tol, hFloat, 0);

        if (tq != aq)
        {
            static int didfirstprint = 0;
            ++failcount;
            if (didfirstprint == 0)
            {
                tq = tableQuantize (hval, tol, hFloat, 1);
                aq = algoQuantize (hval, halfTol, tol, hFloat, 1);
                didfirstprint = 1;
                printf ("ERROR: tol %g half %u 0x%04X %g: table 0x%04X %g algo 0x%04X %g\n",
                        tol, hval, hval, imath_half_to_float (hval),
                        tq, imath_half_to_float (tq),
                        aq, imath_half_to_float (aq));
            }
        }
        //EXRCORE_TEST (tableQuantize (hval, tol) == algoQuantize (hval, halfTol));
    }
    if (failcount > 0)
        printf ("ERROR: tol %g: %d fails\n", tol, failcount);
    //else
    //    printf ("SUCCESS: tol %g: %d fails\n", tol, failcount);
}